

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O2

Cnf_Dat_t * Cnf_DeriveSimpleForRetiming(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Cnf_Dat_t *pCVar3;
  int **ppiVar4;
  int *piVar5;
  long lVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  int **ppiVar14;
  
  iVar10 = p->nObjs[6] + p->nObjs[5];
  iVar9 = iVar10 * 7 + p->nObjs[3] * 5 + 1;
  iVar10 = iVar10 + p->nObjs[3];
  iVar8 = iVar10 * 3 + 1;
  pCVar3 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar3->pMan = p;
  pCVar3->nLiterals = iVar9;
  pCVar3->nClauses = iVar8;
  ppiVar4 = (int **)malloc((long)(iVar10 * 3 + 2) << 3);
  pCVar3->pClauses = ppiVar4;
  lVar11 = (long)iVar9;
  piVar5 = (int *)malloc(lVar11 * 4);
  *ppiVar4 = piVar5;
  ppiVar4[iVar8] = piVar5 + lVar11;
  lVar12 = (long)p->vObjs->nSize;
  piVar5 = (int *)malloc(lVar12 * 4);
  pCVar3->pVarNums = piVar5;
  for (lVar6 = 0; lVar6 < lVar12; lVar6 = lVar6 + 1) {
    piVar5[lVar6] = -1;
  }
  iVar9 = 0;
  while( true ) {
    iVar10 = iVar9 + 1;
    if (p->vCos->nSize <= iVar9) break;
    pvVar7 = Vec_PtrEntry(p->vCos,iVar9);
    piVar5[*(int *)((long)pvVar7 + 0x24)] = iVar10;
    iVar9 = iVar10;
  }
  for (iVar9 = 0; iVar9 < p->vObjs->nSize; iVar9 = iVar9 + 1) {
    pvVar7 = Vec_PtrEntry(p->vObjs,iVar9);
    if ((pvVar7 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7)) {
      piVar5[*(int *)((long)pvVar7 + 0x24)] = iVar10;
      iVar10 = iVar10 + 1;
    }
  }
  iVar9 = 0;
  while( true ) {
    if (p->vCis->nSize <= iVar9) break;
    pvVar7 = Vec_PtrEntry(p->vCis,iVar9);
    piVar5[*(int *)((long)pvVar7 + 0x24)] = iVar10 + iVar9;
    iVar9 = iVar9 + 1;
  }
  piVar5[p->pConst1->Id] = iVar10 + iVar9;
  pCVar3->nVars = iVar10 + iVar9 + 1;
  piVar5 = *ppiVar4;
  iVar9 = 0;
  while( true ) {
    iVar10 = p->vObjs->nSize;
    if (iVar10 <= iVar9) break;
    pvVar7 = Vec_PtrEntry(p->vObjs,iVar9);
    if ((pvVar7 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7)) {
      piVar13 = pCVar3->pVarNums;
      iVar10 = piVar13[*(int *)((long)pvVar7 + 0x24)];
      iVar1 = piVar13[*(int *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x24)];
      iVar2 = piVar13[*(int *)((*(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe) + 0x24)];
      *ppiVar4 = piVar5;
      *piVar5 = iVar10 * 2;
      piVar5[1] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar1 * 2 ^ 1;
      piVar5[2] = (*(uint *)((long)pvVar7 + 0x10) & 1) + iVar2 * 2 ^ 1;
      ppiVar4[1] = piVar5 + 3;
      iVar10 = iVar10 * 2 + 1;
      piVar5[3] = iVar10;
      piVar5[4] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar1 * 2;
      ppiVar4[2] = piVar5 + 5;
      ppiVar4 = ppiVar4 + 3;
      piVar5[5] = iVar10;
      piVar5[6] = (*(uint *)((long)pvVar7 + 0x10) & 1) + iVar2 * 2;
      piVar5 = piVar5 + 7;
    }
    iVar9 = iVar9 + 1;
  }
  iVar9 = pCVar3->pVarNums[p->pConst1->Id];
  if (iVar9 <= iVar10) {
    *ppiVar4 = piVar5;
    ppiVar4 = ppiVar4 + 1;
    *piVar5 = iVar9 * 2;
    piVar5 = piVar5 + 1;
    piVar13 = piVar5;
    ppiVar14 = ppiVar4;
    for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
      pvVar7 = Vec_PtrEntry(p->vCos,iVar9);
      iVar1 = pCVar3->pVarNums[*(int *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x24)]
      ;
      iVar10 = pCVar3->pVarNums[*(int *)((long)pvVar7 + 0x24)];
      *ppiVar4 = piVar13;
      *piVar13 = iVar10 * 2;
      piVar13[1] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar1 * 2 ^ 1;
      ppiVar4[1] = piVar13 + 2;
      iVar10 = iVar10 * 2 + 1;
      piVar13[2] = iVar10;
      piVar13[3] = (*(uint *)((long)pvVar7 + 8) & 1) + iVar1 * 2;
      ppiVar4[2] = piVar13 + 4;
      piVar13[4] = iVar10;
      piVar5 = piVar5 + 5;
      ppiVar14 = ppiVar14 + 3;
      piVar13 = piVar13 + 5;
      ppiVar4 = ppiVar4 + 3;
    }
    if ((long)piVar5 - (long)*pCVar3->pClauses >> 2 == lVar11) {
      if ((long)ppiVar14 - (long)pCVar3->pClauses >> 3 == (long)iVar8) {
        return pCVar3;
      }
      __assert_fail("pClas - pCnf->pClauses == nClauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                    ,0x31c,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
    }
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x31b,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
  }
  __assert_fail("OutVar <= Aig_ManObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                ,0x304,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
}

Assistant:

Cnf_Dat_t * Cnf_DeriveSimpleForRetiming( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    int i, nLiterals, nClauses, Number;

    // count the number of literals and clauses
    nLiterals = 1 + 7 * Aig_ManNodeNum(p) + 5 * Aig_ManCoNum(p);
    nClauses = 1 + 3 * Aig_ManNodeNum(p) + 3 * Aig_ManCoNum(p);

    // allocate CNF
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = p;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;

    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p) );
    for ( i = 0; i < Aig_ManObjNumMax(p); i++ )
        pCnf->pVarNums[i] = -1;
    // assign variables to the last (nOutputs) POs
    Number = 1;
    Aig_ManForEachCo( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    pCnf->pVarNums[Aig_ManConst1(p)->Id] = Number++;
    pCnf->nVars = Number;
    // assign the clauses
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Aig_ManForEachNode( p, pObj, i )
    {
        OutVar   = pCnf->pVarNums[ pObj->Id ];
        pVars[0] = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        pVars[1] = pCnf->pVarNums[ Aig_ObjFanin1(pObj)->Id ];

        // positive phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar; 
        *pLits++ = 2 * pVars[0] + !Aig_ObjFaninC0(pObj); 
        *pLits++ = 2 * pVars[1] + !Aig_ObjFaninC1(pObj); 
        // negative phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[0] + Aig_ObjFaninC0(pObj); 
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[1] + Aig_ObjFaninC1(pObj); 
    }
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // write the output literals
    Aig_ManForEachCo( p, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        PoVar  = pCnf->pVarNums[ pObj->Id ];
        // first clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar; 
        *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
        // second clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
        *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        // final clause (init-state is always 0 -> set the output to 0)
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
    return pCnf;
}